

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O0

LY_ERR json_print_node(jsonpr_ctx *pctx,lyd_node *node)

{
  uint16_t uVar1;
  ly_bool lVar2;
  int iVar3;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  lyd_node *node_local;
  jsonpr_ctx *pctx_local;
  
  lVar2 = lyd_node_should_print(node,pctx->options);
  if (lVar2 == '\0') {
    lVar2 = json_print_array_is_last_inst(pctx,node);
    if (lVar2 != '\0') {
      json_print_array_close(pctx);
    }
    return LY_SUCCESS;
  }
  if (node->schema == (lysc_node *)0x0) {
    pctx_local._4_4_ = json_print_opaq(pctx,(lyd_node_opaq *)node);
    goto joined_r0x0015a9e8;
  }
  uVar1 = node->schema->nodetype;
  if (uVar1 != 1) {
    if (uVar1 == 4) {
      pctx_local._4_4_ = json_print_leaf(pctx,node);
      goto joined_r0x0015a9e8;
    }
    if ((uVar1 == 8) || (uVar1 == 0x10)) {
      pctx_local._4_4_ = json_print_leaf_list(pctx,node);
      goto joined_r0x0015a9e8;
    }
    if ((uVar1 == 0x20) || (uVar1 == 0x60)) {
      pctx_local._4_4_ = json_print_any(pctx,node);
      goto joined_r0x0015a9e8;
    }
    if ((uVar1 != 0x100) && ((uVar1 != 0x200 && (uVar1 != 0x400)))) {
      ly_log(pctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
             ,0x3fe);
      return LY_EMEM;
    }
  }
  pctx_local._4_4_ = json_print_container(pctx,node);
joined_r0x0015a9e8:
  if (pctx_local._4_4_ == LY_SUCCESS) {
    pctx->level_printed = pctx->level;
    if ((pctx->first_leaflist != (lyd_node *)0x0) &&
       (iVar3 = matching_node(node->next,pctx->first_leaflist), iVar3 == 0)) {
      json_print_meta_attr_leaflist(pctx);
      pctx->first_leaflist = (lyd_node *)0x0;
    }
    pctx_local._4_4_ = LY_SUCCESS;
  }
  return pctx_local._4_4_;
}

Assistant:

static LY_ERR
json_print_node(struct jsonpr_ctx *pctx, const struct lyd_node *node)
{
    if (!lyd_node_should_print(node, pctx->options)) {
        if (json_print_array_is_last_inst(pctx, node)) {
            json_print_array_close(pctx);
        }
        return LY_SUCCESS;
    }

    if (!node->schema) {
        LY_CHECK_RET(json_print_opaq(pctx, (const struct lyd_node_opaq *)node));
    } else {
        switch (node->schema->nodetype) {
        case LYS_RPC:
        case LYS_ACTION:
        case LYS_NOTIF:
        case LYS_CONTAINER:
            LY_CHECK_RET(json_print_container(pctx, node));
            break;
        case LYS_LEAF:
            LY_CHECK_RET(json_print_leaf(pctx, node));
            break;
        case LYS_LEAFLIST:
        case LYS_LIST:
            LY_CHECK_RET(json_print_leaf_list(pctx, node));
            break;
        case LYS_ANYDATA:
        case LYS_ANYXML:
            LY_CHECK_RET(json_print_any(pctx, node));
            break;
        default:
            LOGINT(pctx->ctx);
            return EXIT_FAILURE;
        }
    }

    pctx->level_printed = pctx->level;

    if (pctx->first_leaflist && !matching_node(node->next, pctx->first_leaflist)) {
        json_print_meta_attr_leaflist(pctx);
        pctx->first_leaflist = NULL;
    }

    return LY_SUCCESS;
}